

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::enum_to_stem_string::unitWidth(UNumberUnitWidth value,UnicodeString *sb)

{
  ConstChar16Ptr local_50;
  ConstChar16Ptr local_48;
  ConstChar16Ptr local_40;
  ConstChar16Ptr local_38 [3];
  ConstChar16Ptr local_20;
  UnicodeString *local_18;
  UnicodeString *sb_local;
  UNumberUnitWidth value_local;
  
  local_18 = sb;
  sb_local._4_4_ = value;
  switch(value) {
  case UNUM_UNIT_WIDTH_NARROW:
    ConstChar16Ptr::ConstChar16Ptr(&local_20,L"unit-width-narrow");
    UnicodeString::append(sb,&local_20,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_20);
    break;
  case UNUM_UNIT_WIDTH_SHORT:
    ConstChar16Ptr::ConstChar16Ptr(local_38,L"unit-width-short");
    UnicodeString::append(sb,local_38,-1);
    ConstChar16Ptr::~ConstChar16Ptr(local_38);
    break;
  case UNUM_UNIT_WIDTH_FULL_NAME:
    ConstChar16Ptr::ConstChar16Ptr(&local_40,L"unit-width-full-name");
    UnicodeString::append(sb,&local_40,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_40);
    break;
  case UNUM_UNIT_WIDTH_ISO_CODE:
    ConstChar16Ptr::ConstChar16Ptr(&local_48,L"unit-width-iso-code");
    UnicodeString::append(sb,&local_48,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_48);
    break;
  case UNUM_UNIT_WIDTH_HIDDEN:
    ConstChar16Ptr::ConstChar16Ptr(&local_50,L"unit-width-hidden");
    UnicodeString::append(sb,&local_50,-1);
    ConstChar16Ptr::~ConstChar16Ptr(&local_50);
  }
  return;
}

Assistant:

void enum_to_stem_string::unitWidth(UNumberUnitWidth value, UnicodeString& sb) {
    switch (value) {
        case UNUM_UNIT_WIDTH_NARROW:
            sb.append(u"unit-width-narrow", -1);
            break;
        case UNUM_UNIT_WIDTH_SHORT:
            sb.append(u"unit-width-short", -1);
            break;
        case UNUM_UNIT_WIDTH_FULL_NAME:
            sb.append(u"unit-width-full-name", -1);
            break;
        case UNUM_UNIT_WIDTH_ISO_CODE:
            sb.append(u"unit-width-iso-code", -1);
            break;
        case UNUM_UNIT_WIDTH_HIDDEN:
            sb.append(u"unit-width-hidden", -1);
            break;
        default:
            U_ASSERT(false);
    }
}